

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.cpp
# Opt level: O0

QueuedFullJitWorkItem * __thiscall
CodeGenWorkItem::EnsureQueuedFullJitWorkItem(CodeGenWorkItem *this)

{
  HeapAllocator *alloc;
  QueuedFullJitWorkItem *this_00;
  TrackAllocData local_40;
  CodeGenWorkItem *local_18;
  CodeGenWorkItem *this_local;
  
  if (this->queuedFullJitWorkItem == (QueuedFullJitWorkItem *)0x0) {
    local_18 = this;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&QueuedFullJitWorkItem::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.cpp"
               ,0xe8);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_40);
    this_00 = (QueuedFullJitWorkItem *)new<Memory::HeapAllocator>(0x18,alloc,true,0x469be0);
    QueuedFullJitWorkItem::QueuedFullJitWorkItem(this_00,this);
    this->queuedFullJitWorkItem = this_00;
    this_local = (CodeGenWorkItem *)this->queuedFullJitWorkItem;
  }
  else {
    this_local = (CodeGenWorkItem *)this->queuedFullJitWorkItem;
  }
  return (QueuedFullJitWorkItem *)this_local;
}

Assistant:

QueuedFullJitWorkItem *CodeGenWorkItem::EnsureQueuedFullJitWorkItem()
{
    if(queuedFullJitWorkItem)
    {
        return queuedFullJitWorkItem;
    }

    queuedFullJitWorkItem = HeapNewNoThrow(QueuedFullJitWorkItem, this);
    return queuedFullJitWorkItem;
}